

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sk_gen.c
# Opt level: O0

int genpoly_gen(gf *out,gf *f)

{
  gf gVar1;
  gf gVar2;
  long in_RSI;
  long in_RDI;
  gf t;
  gf inv;
  gf mask;
  gf mat [65] [64];
  int c;
  int k;
  int j;
  int i;
  gf local_20a8 [64];
  undefined2 auStack_2028 [60];
  gf *in_stack_ffffffffffffe050;
  gf *in_stack_ffffffffffffe058;
  gf *in_stack_ffffffffffffe060;
  undefined2 auStack_a8 [64];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_10;
  
  local_20a8[0] = 1;
  for (local_1c = 1; local_1c < 0x40; local_1c = local_1c + 1) {
    local_20a8[local_1c] = 0;
  }
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    auStack_2028[local_1c] = *(undefined2 *)(in_RSI + (long)local_1c * 2);
  }
  local_10 = in_RDI;
  for (local_20 = 2; local_20 < 0x41; local_20 = local_20 + 1) {
    GF_mul(in_stack_ffffffffffffe060,in_stack_ffffffffffffe058,in_stack_ffffffffffffe050);
  }
  local_20 = 0;
  while( true ) {
    local_24 = local_20;
    if (0x3f < local_20) {
      for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
        *(undefined2 *)(local_10 + (long)local_1c * 2) = auStack_a8[local_1c];
      }
      return 0;
    }
    while (local_24 = local_24 + 1, local_24 < 0x40) {
      gVar1 = gf_iszero(local_20a8[(long)local_20 * 0x40 + (long)local_20]);
      for (local_28 = local_20; local_28 < 0x41; local_28 = local_28 + 1) {
        local_20a8[(long)local_28 * 0x40 + (long)local_20] =
             local_20a8[(long)local_28 * 0x40 + (long)local_20] ^
             local_20a8[(long)local_28 * 0x40 + (long)local_24] & gVar1;
      }
    }
    if (local_20a8[(long)local_20 * 0x40 + (long)local_20] == 0) break;
    gVar1 = gf_inv(0);
    for (local_28 = local_20; local_28 < 0x41; local_28 = local_28 + 1) {
      gVar2 = gf_mul(local_20a8[(long)local_28 * 0x40 + (long)local_20],gVar1);
      local_20a8[(long)local_28 * 0x40 + (long)local_20] = gVar2;
    }
    for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
      if (local_24 != local_20) {
        gVar1 = local_20a8[(long)local_20 * 0x40 + (long)local_24];
        for (local_28 = local_20; local_28 < 0x41; local_28 = local_28 + 1) {
          gVar2 = gf_mul(local_20a8[(long)local_28 * 0x40 + (long)local_20],gVar1);
          local_20a8[(long)local_28 * 0x40 + (long)local_24] =
               local_20a8[(long)local_28 * 0x40 + (long)local_24] ^ gVar2;
        }
      }
    }
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

int genpoly_gen(gf *out, gf *f)
{
	int i, j, k, c;

	gf mat[ SYS_T+1 ][ SYS_T ];
	gf mask, inv, t;

	// fill matrix

	mat[0][0] = 1;

	for (i = 1; i < SYS_T; i++)
		mat[0][i] = 0;

	for (i = 0; i < SYS_T; i++)
		mat[1][i] = f[i];

	for (j = 2; j <= SYS_T; j++)
		GF_mul(mat[j], mat[j-1], f);

	// gaussian

	for (j = 0; j < SYS_T; j++)
	{
		for (k = j + 1; k < SYS_T; k++)
		{
			mask = gf_iszero(mat[ j ][ j ]);

			for (c = j; c < SYS_T + 1; c++)
				mat[ c ][ j ] ^= mat[ c ][ k ] & mask;

		}

		if ( mat[ j ][ j ] == 0 ) // return if not systematic
		{
			return -1;
		}

		inv = gf_inv(mat[j][j]);

		for (c = j; c < SYS_T + 1; c++)
			mat[ c ][ j ] = gf_mul(mat[ c ][ j ], inv) ;

		for (k = 0; k < SYS_T; k++)
		{
			if (k != j)
			{
				t = mat[ j ][ k ];

				for (c = j; c < SYS_T + 1; c++)
					mat[ c ][ k ] ^= gf_mul(mat[ c ][ j ], t);
			}
		}
	}

	for (i = 0; i < SYS_T; i++)
		out[i] = mat[ SYS_T ][ i ];

	return 0;
}